

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Bool prvTidyIsWord2000(TidyDocImpl *doc)

{
  int iVar1;
  Node *pNVar2;
  AttVal *pAVar3;
  ctmbstr ptVar4;
  
  pNVar2 = prvTidyFindHTML(doc);
  if ((pNVar2 != (Node *)0x0) &&
     (pAVar3 = prvTidyGetAttrByName(pNVar2,"xmlns:o"), pAVar3 != (AttVal *)0x0)) {
    return yes;
  }
  pNVar2 = prvTidyFindHEAD(doc);
  if (pNVar2 != (Node *)0x0) {
    for (pNVar2 = pNVar2->content; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next) {
      if (((((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_META)) &&
           (pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_NAME), pAVar3 != (AttVal *)0x0)) &&
          ((pAVar3->value != (ctmbstr)0x0 &&
           (iVar1 = prvTidytmbstrcasecmp(pAVar3->value,"generator"), iVar1 == 0)))) &&
         ((pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_CONTENT), pAVar3 != (AttVal *)0x0 &&
          ((pAVar3->value != (ctmbstr)0x0 &&
           (ptVar4 = prvTidytmbsubstr(pAVar3->value,"Microsoft"), ptVar4 != (ctmbstr)0x0)))))) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

Bool TY_(IsWord2000)( TidyDocImpl* doc )
{
    AttVal *attval;
    Node *node, *head;
    Node *html = TY_(FindHTML)( doc );

    if (html && TY_(GetAttrByName)(html, "xmlns:o"))
        return yes;
    
    /* search for <meta name="GENERATOR" content="Microsoft ..."> */
    head = TY_(FindHEAD)( doc );

    if (head)
    {
        for (node = head->content; node; node = node->next)
        {
            if ( !nodeIsMETA(node) )
                continue;

            attval = TY_(AttrGetById)( node, TidyAttr_NAME );

            if ( !AttrValueIs(attval, "generator") )
                continue;

            attval =  TY_(AttrGetById)( node, TidyAttr_CONTENT );

            if ( AttrContains(attval, "Microsoft") )
                return yes;
        }
    }

    return no;
}